

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::DOMNodeImpl::isDefaultNamespace(DOMNodeImpl *this,XMLCh *namespaceURI)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *str2;
  undefined4 extraout_var_02;
  DOMNode *pDVar5;
  DOMNode *local_88;
  DOMNode *ancestor_1;
  DOMNode *ancestor;
  XMLCh *value;
  DOMNode *attr;
  DOMElement *elem;
  XMLCh *prefix;
  short type;
  DOMNode *thisNode;
  XMLCh *namespaceURI_local;
  DOMNodeImpl *this_local;
  
  local_88 = getContainingNode(this);
  iVar3 = (*local_88->_vptr_DOMNode[4])();
  switch((short)iVar3) {
  case 1:
    iVar3 = (*local_88->_vptr_DOMNode[0x17])();
    if (((short *)CONCAT44(extraout_var,iVar3) == (short *)0x0) ||
       (*(short *)CONCAT44(extraout_var,iVar3) == 0)) {
      iVar3 = (*local_88->_vptr_DOMNode[0x16])();
      this_local._7_1_ = XMLString::equals(namespaceURI,(XMLCh *)CONCAT44(extraout_var_00,iVar3));
    }
    else {
      uVar4 = (*local_88->_vptr_DOMNode[0x1a])();
      if ((uVar4 & 1) != 0) {
        iVar3 = (*local_88->_vptr_DOMNode[0x33])
                          (local_88,XMLUni::fgXMLNSURIName,XMLUni::fgXMLNSString);
        if ((long *)CONCAT44(extraout_var_01,iVar3) != (long *)0x0) {
          str2 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x18))();
          bVar1 = XMLString::equals(namespaceURI,str2);
          return bVar1;
        }
      }
      pDVar5 = getElementAncestor(this,local_88);
      if (pDVar5 == (DOMNode *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        iVar3 = (*pDVar5->_vptr_DOMNode[0x24])(pDVar5,namespaceURI);
        this_local._7_1_ = (bool)((byte)iVar3 & 1);
      }
    }
    break;
  case 2:
    iVar3 = (*this->fOwnerNode->_vptr_DOMNode[4])();
    if (iVar3 == 1) {
      iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0x24])(this->fOwnerNode,namespaceURI);
      this_local._7_1_ = (bool)((byte)iVar3 & 1);
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  default:
    pDVar5 = getElementAncestor(this,local_88);
    if (pDVar5 == (DOMNode *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      iVar3 = (*pDVar5->_vptr_DOMNode[0x24])(pDVar5,namespaceURI);
      this_local._7_1_ = (bool)((byte)iVar3 & 1);
    }
    break;
  case 6:
  case 10:
  case 0xb:
  case 0xc:
    this_local._7_1_ = false;
    break;
  case 9:
    if (local_88 == (DOMNode *)0x0) {
      local_88 = (DOMNode *)0x0;
    }
    else {
      local_88 = local_88 + -3;
    }
    iVar3 = (*local_88->_vptr_DOMNode[0xd])();
    bVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x120))
                      ((long *)CONCAT44(extraout_var_02,iVar3),namespaceURI);
    this_local._7_1_ = (bool)(bVar2 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool DOMNodeImpl::isDefaultNamespace(const XMLCh* namespaceURI) const {
	const DOMNode *thisNode = getContainingNode();
    short type = thisNode->getNodeType();
    switch (type) {
    case DOMNode::ELEMENT_NODE: {
        const XMLCh *prefix = thisNode->getPrefix();

        // REVISIT: is it possible that prefix is empty string?
        if (prefix == 0 || !*prefix) {
            return XMLString::equals(namespaceURI, thisNode->getNamespaceURI());
        }

        if (thisNode->hasAttributes()) {
            DOMElement *elem = (DOMElement *)thisNode;
            DOMNode *attr = elem->getAttributeNodeNS(XMLUni::fgXMLNSURIName, XMLUni::fgXMLNSString);
            if (attr != 0) {
                const XMLCh *value = attr->getNodeValue();
                return XMLString::equals(namespaceURI, value);
            }
        }
        DOMNode *ancestor = getElementAncestor(thisNode);
        if (ancestor != 0) {
            return ancestor->isDefaultNamespace(namespaceURI);
        }

        return false;
    }
    case DOMNode::DOCUMENT_NODE:{
        return ((DOMDocument*)thisNode)->getDocumentElement()->isDefaultNamespace(namespaceURI);
    }

    case DOMNode::ENTITY_NODE :
    case DOMNode::NOTATION_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    case DOMNode::DOCUMENT_TYPE_NODE:
        // type is unknown
        return false;
    case DOMNode::ATTRIBUTE_NODE:{
        if (fOwnerNode->getNodeType() == DOMNode::ELEMENT_NODE) {
            return fOwnerNode->isDefaultNamespace(namespaceURI);

        }
        return false;
    }
    default:{
        DOMNode *ancestor = getElementAncestor(thisNode);
        if (ancestor != 0) {
            return ancestor->isDefaultNamespace(namespaceURI);
        }
        return false;
    }

    }
}